

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O2

REF_STATUS ref_interp_locate_nearest(REF_INTERP ref_interp)

{
  REF_INT *value;
  REF_INT RVar1;
  REF_MPI pRVar2;
  REF_CELL pRVar3;
  REF_NODE pRVar4;
  REF_NODE pRVar5;
  REF_DBL *pRVar6;
  int cell;
  REF_LIST pRVar7;
  REF_SEARCH ref_search_00;
  uint uVar8;
  REF_STATUS RVar9;
  ulong uVar10;
  void *my_array;
  REF_INT *proc;
  REF_INT *pRVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  undefined8 uVar15;
  REF_INT RVar16;
  long lVar17;
  char *pcVar18;
  int iVar19;
  uint uVar20;
  REF_STATUS ref_private_macro_code_rxs;
  size_t sVar21;
  double dVar22;
  REF_DBL RVar23;
  long local_350;
  REF_INT total_node;
  REF_MPI local_338;
  REF_DBL *local_330;
  void *local_328;
  long local_320;
  REF_NODE local_318;
  REF_CELL local_310;
  void *local_308;
  REF_DBL *local_300;
  REF_INT *local_2f8;
  double local_2f0;
  REF_DBL *global_xyz;
  REF_LIST ref_list;
  void *local_2d8;
  void *local_2d0;
  REF_SEARCH ref_search;
  REF_INT *source;
  REF_BOOL increase_fuzz;
  REF_INT nrecv;
  REF_INT tet1;
  REF_INT tet0;
  REF_CELL local_2a8;
  void *local_2a0;
  REF_INT *recv_node;
  REF_INT *recv_cell;
  REF_INT *recv_proc;
  REF_INT *global_node;
  double local_278 [4];
  void *local_258;
  REF_NODE local_250;
  REF_CELL local_248;
  REF_DBL radius;
  REF_DBL bary [4];
  REF_INT tri_nodes [27];
  REF_DBL center [3];
  REF_INT nodes [27];
  REF_INT nodes_1 [27];
  REF_INT tet_nodes [27];
  
  pRVar2 = ref_interp->ref_mpi;
  pRVar3 = ref_interp->from_tri;
  pRVar4 = ref_interp->from_grid->node;
  if ((ref_interp->instrument != 0) && (uVar8 = ref_mpi_stopwatch_start(pRVar2), uVar8 != 0)) {
    uVar10 = (ulong)uVar8;
    pcVar18 = "locate clock";
    uVar15 = 0x72b;
    goto LAB_00173edd;
  }
  uVar8 = ref_interp_seed_tree(ref_interp);
  if (uVar8 != 0) {
    uVar10 = (ulong)uVar8;
    pcVar18 = "seed tree nodes";
    uVar15 = 0x72d;
    goto LAB_00173edd;
  }
  if ((ref_interp->instrument != 0) &&
     (uVar8 = ref_mpi_stopwatch_stop(pRVar2,"seed tree"), uVar8 != 0)) {
    uVar10 = (ulong)uVar8;
    pcVar18 = "locate clock";
    uVar15 = 0x72f;
    goto LAB_00173edd;
  }
  uVar8 = ref_interp_process_agents(ref_interp);
  if (uVar8 != 0) {
    uVar10 = (ulong)uVar8;
    pcVar18 = "drain";
    uVar15 = 0x731;
    goto LAB_00173edd;
  }
  if ((ref_interp->instrument != 0) && (uVar8 = ref_mpi_stopwatch_stop(pRVar2,"drain"), uVar8 != 0))
  {
    uVar10 = (ulong)uVar8;
    pcVar18 = "locate clock";
    uVar15 = 0x733;
    goto LAB_00173edd;
  }
  increase_fuzz = 0;
  uVar8 = ref_interp_tree(ref_interp,&increase_fuzz);
  if (uVar8 != 0) {
    uVar10 = (ulong)uVar8;
    pcVar18 = "tree";
    uVar15 = 0x736;
    goto LAB_00173edd;
  }
  if ((ref_interp->instrument != 0) && (uVar8 = ref_mpi_stopwatch_stop(pRVar2,"tree"), uVar8 != 0))
  {
    uVar10 = (ulong)uVar8;
    pcVar18 = "locate clock";
    uVar15 = 0x738;
    goto LAB_00173edd;
  }
  if (increase_fuzz == 0) {
    return 0;
  }
  uVar8 = ref_search_create(&ref_search,pRVar3->n);
  if (uVar8 != 0) {
    uVar10 = (ulong)uVar8;
    pcVar18 = "create search";
    uVar15 = 0x73b;
    goto LAB_00173edd;
  }
  for (iVar19 = 0; ref_search_00 = ref_search, iVar19 < pRVar3->max; iVar19 = iVar19 + 1) {
    RVar9 = ref_cell_nodes(pRVar3,iVar19,nodes);
    if (RVar9 == 0) {
      uVar8 = ref_node_bounding_sphere(pRVar4,nodes,3,center,&radius);
      if (uVar8 != 0) {
        uVar10 = (ulong)uVar8;
        pcVar18 = "b";
        uVar15 = 0x73d;
        goto LAB_00173edd;
      }
      uVar8 = ref_search_insert(ref_search,iVar19,center,ref_interp->search_donor_scale * radius);
      if (uVar8 != 0) {
        uVar10 = (ulong)uVar8;
        pcVar18 = "ins";
        uVar15 = 0x740;
        goto LAB_00173edd;
      }
    }
  }
  local_338 = ref_interp->ref_mpi;
  pRVar4 = ref_interp->from_grid->node;
  pRVar3 = ref_interp->from_tet;
  pRVar5 = ref_interp->to_grid->node;
  uVar8 = ref_list_create(&ref_list);
  if (uVar8 == 0) {
    uVar10 = 0;
    uVar8 = pRVar5->max;
    if (pRVar5->max < 1) {
      uVar8 = 0;
    }
    uVar20 = 0;
    for (; uVar8 != uVar10; uVar10 = uVar10 + 1) {
      if ((-1 < pRVar5->global[uVar10]) && (pRVar5->ref_mpi->id == pRVar5->part[uVar10])) {
        uVar20 = uVar20 + (ref_interp->cell[uVar10] == -1);
      }
    }
    local_250 = pRVar4;
    local_248 = pRVar3;
    if ((int)uVar20 < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
             0x567,"ref_interp_nearest_tet_via_tri_in_tree","malloc local_node of REF_INT negative")
      ;
      uVar10 = 1;
    }
    else {
      local_2d0 = malloc((ulong)uVar20 << 2);
      if (local_2d0 == (void *)0x0) {
        pcVar18 = "malloc local_node of REF_INT NULL";
        uVar15 = 0x567;
      }
      else {
        my_array = malloc((ulong)(uVar20 * 3) << 3);
        pRVar2 = local_338;
        if (my_array != (void *)0x0) {
          lVar12 = 0x10;
          iVar19 = 0;
          for (uVar10 = 0; uVar8 != uVar10; uVar10 = uVar10 + 1) {
            if (((-1 < pRVar5->global[uVar10]) && (pRVar5->ref_mpi->id == pRVar5->part[uVar10])) &&
               (ref_interp->cell[uVar10] == -1)) {
              *(int *)((long)local_2d0 + (long)iVar19 * 4) = (int)uVar10;
              pRVar6 = pRVar5->real;
              lVar17 = (long)(iVar19 * 3);
              *(undefined8 *)((long)my_array + lVar17 * 8) =
                   *(undefined8 *)((long)pRVar6 + lVar12 + -0x10);
              *(undefined8 *)((long)my_array + lVar17 * 8 + 8) =
                   *(undefined8 *)((long)pRVar6 + lVar12 + -8);
              *(undefined8 *)((long)my_array + lVar17 * 8 + 0x10) =
                   *(undefined8 *)((long)pRVar6 + lVar12);
              iVar19 = iVar19 + 1;
            }
            lVar12 = lVar12 + 0x78;
          }
          local_258 = my_array;
          uVar8 = ref_mpi_allconcat(local_338,3,iVar19,my_array,&total_node,&source,&global_xyz,3);
          if (uVar8 != 0) {
            uVar10 = (ulong)uVar8;
            pcVar18 = "cat";
            uVar15 = 0x575;
            goto LAB_00174156;
          }
          free(source);
          uVar10 = 1;
          uVar8 = ref_mpi_allconcat(pRVar2,1,iVar19,local_2d0,&total_node,&source,&global_node,1);
          if (uVar8 == 0) {
            lVar12 = (long)total_node;
            if (-1 < lVar12) {
              local_300 = (REF_DBL *)malloc(lVar12 * 8);
              if (local_300 == (REF_DBL *)0x0) {
                pcVar18 = "malloc best_bary of REF_DBL NULL";
                uVar15 = 0x57b;
              }
              else {
                sVar21 = lVar12 << 2;
                local_2d8 = malloc(sVar21);
                if (local_2d8 == (void *)0x0) {
                  pcVar18 = "malloc best_node of REF_INT NULL";
                  uVar15 = 0x57c;
                }
                else {
                  local_308 = malloc(sVar21);
                  if (local_308 == (void *)0x0) {
                    pcVar18 = "malloc best_cell of REF_INT NULL";
                    uVar15 = 0x57d;
                  }
                  else {
                    local_2f8 = (REF_INT *)malloc(sVar21);
                    if (local_2f8 != (REF_INT *)0x0) {
                      local_320 = 0;
                      do {
                        if (total_node <= local_320) {
                          uVar8 = ref_mpi_allminwho(local_338,local_300,local_2f8,total_node);
                          RVar16 = total_node;
                          if (uVar8 == 0) {
                            uVar10 = 0;
                            uVar13 = 0;
                            if (0 < total_node) {
                              uVar13 = (ulong)(uint)total_node;
                            }
                            uVar8 = 0;
                            for (; uVar13 != uVar10; uVar10 = uVar10 + 1) {
                              uVar8 = uVar8 + (local_338->id == local_2f8[uVar10]);
                            }
                            local_310 = (REF_CELL)malloc((ulong)(uVar8 * 4) << 3);
                            if (local_310 == (REF_CELL)0x0) {
                              pcVar18 = "malloc send_bary of REF_DBL NULL";
                              uVar15 = 0x59d;
                              goto LAB_001743a3;
                            }
                            sVar21 = (ulong)uVar8 * 4;
                            local_330 = (REF_DBL *)malloc(sVar21);
                            if (local_330 == (REF_DBL *)0x0) {
                              pcVar18 = "malloc send_cell of REF_INT NULL";
                              uVar15 = 0x59e;
                              goto LAB_001743a3;
                            }
                            local_318 = (REF_NODE)malloc(sVar21);
                            if (local_318 == (REF_NODE)0x0) {
                              pcVar18 = "malloc send_node of REF_INT NULL";
                              uVar15 = 0x59f;
                              goto LAB_001743a3;
                            }
                            proc = (REF_INT *)malloc(sVar21);
                            if (proc == (REF_INT *)0x0) {
                              pcVar18 = "malloc send_proc of REF_INT NULL";
                              uVar15 = 0x5a0;
                              goto LAB_001743a3;
                            }
                            local_328 = malloc(sVar21);
                            if (local_328 == (void *)0x0) {
                              pcVar18 = "malloc my_proc of REF_INT NULL";
                              uVar15 = 0x5a1;
                              goto LAB_001743a3;
                            }
                            for (uVar10 = 0; uVar8 != uVar10; uVar10 = uVar10 + 1) {
                              *(REF_INT *)((long)local_328 + uVar10 * 4) = local_338->id;
                            }
                            lVar12 = 0;
                            iVar19 = 0;
                            for (lVar17 = 0; lVar17 < RVar16; lVar17 = lVar17 + 1) {
                              if (local_338->id == local_2f8[lVar17]) {
                                lVar14 = (long)iVar19;
                                proc[lVar14] = source[lVar17];
                                RVar1 = *(REF_INT *)((long)local_2d8 + lVar17 * 4);
                                local_2f0 = (double)CONCAT44(local_2f0._4_4_,RVar1);
                                (&local_318->n)[lVar14] = RVar1;
                                uVar8 = *(uint *)((long)local_308 + lVar17 * 4);
                                *(uint *)((long)local_330 + lVar14 * 4) = uVar8;
                                if (uVar8 != 0xffffffff) {
                                  uVar20 = ref_cell_nodes(local_248,uVar8,nodes_1);
                                  if (uVar20 != 0) {
                                    uVar10 = (ulong)uVar20;
                                    printf("%s: %d: %s: %d %s\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                           ,0x5ad,"ref_interp_nearest_tet_via_tri_in_tree",
                                           (ulong)uVar20,
                                           "tet should be set and valid via tri search");
                                    printf("global %d best cell %d best bary %e\n",local_300[lVar17]
                                           ,(ulong)local_2f0 & 0xffffffff,(ulong)uVar8);
                                    goto LAB_001743ad;
                                  }
                                  uVar8 = ref_node_bary4(local_250,nodes_1,
                                                         (REF_DBL *)((long)global_xyz + lVar12),
                                                         (REF_DBL *)
                                                         (&local_310->type + (long)(iVar19 * 4) * 2)
                                                        );
                                  RVar16 = total_node;
                                  if (uVar8 != 0) {
                                    uVar10 = (ulong)uVar8;
                                    pcVar18 = "bary";
                                    uVar15 = 0x5b0;
                                    goto LAB_00174156;
                                  }
                                }
                                iVar19 = iVar19 + 1;
                              }
                              lVar12 = lVar12 + 0x18;
                            }
                            uVar8 = ref_mpi_blindsend(local_338,proc,local_318,1,iVar19,&recv_node,
                                                      &nrecv,1);
                            if (uVar8 != 0) {
                              uVar10 = (ulong)uVar8;
                              pcVar18 = "blind send node";
                              uVar15 = 0x5b7;
                              goto LAB_00174156;
                            }
                            uVar8 = ref_mpi_blindsend(local_338,proc,local_330,1,iVar19,&recv_cell,
                                                      &nrecv,1);
                            if (uVar8 != 0) {
                              uVar10 = (ulong)uVar8;
                              pcVar18 = "blind send cell";
                              uVar15 = 0x5ba;
                              goto LAB_00174156;
                            }
                            uVar10 = 1;
                            uVar8 = ref_mpi_blindsend(local_338,proc,local_328,1,iVar19,&recv_proc,
                                                      &nrecv,1);
                            if (uVar8 == 0) {
                              uVar8 = ref_mpi_blindsend(local_338,proc,local_310,4,iVar19,&local_2a0
                                                        ,&nrecv,3);
                              if (uVar8 != 0) {
                                pcVar18 = "blind send bary";
                                uVar15 = 0x5c0;
                                goto LAB_00174f5a;
                              }
                              value = &ref_interp->n_tree;
                              local_350 = 0;
                              for (lVar12 = 0; lVar12 < nrecv; lVar12 = lVar12 + 1) {
                                ref_interp->n_tree = ref_interp->n_tree + 1;
                                iVar19 = recv_node[lVar12];
                                pRVar11 = ref_interp->cell;
                                if ((long)pRVar11[iVar19] != -1) {
                                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                         ,0x5c5,"ref_interp_nearest_tet_via_tri_in_tree",
                                         "tree already found?",0xffffffffffffffff,
                                         (long)pRVar11[iVar19]);
                                  goto LAB_001743ad;
                                }
                                if (ref_interp->agent_hired[iVar19] != 0) {
                                  uVar8 = ref_agents_delete(ref_interp->ref_agents,iVar19);
                                  if (uVar8 != 0) {
                                    uVar10 = (ulong)uVar8;
                                    pcVar18 = "deq";
                                    uVar15 = 0x5c7;
                                    goto LAB_00174156;
                                  }
                                  ref_interp->agent_hired[iVar19] = 0;
                                  pRVar11 = ref_interp->cell;
                                }
                                pRVar11[iVar19] = recv_cell[lVar12];
                                ref_interp->part[iVar19] = recv_proc[lVar12];
                                if (recv_cell[lVar12] == -1) {
                                  *value = *value + -1;
                                }
                                else {
                                  pRVar6 = ref_interp->bary;
                                  for (lVar17 = 0; lVar17 != 4; lVar17 = lVar17 + 1) {
                                    pRVar6[(iVar19 << 2) + lVar17] =
                                         *(REF_DBL *)((long)local_2a0 + lVar17 * 8 + local_350);
                                  }
                                }
                                local_350 = local_350 + 0x20;
                              }
                              uVar8 = ref_mpi_allsum(local_338,value,1,1);
                              if (uVar8 != 0) {
                                pcVar18 = "as";
                                uVar15 = 0x5d4;
                                goto LAB_00174f5a;
                              }
                              free(recv_node);
                              free(recv_cell);
                              free(recv_proc);
                              free(local_2a0);
                              free(local_310);
                              free(local_328);
                              free(local_330);
                              free(local_318);
                              free(proc);
                              free(local_2f8);
                              free(local_308);
                              free(local_2d8);
                              free(local_300);
                              free(source);
                              free(global_node);
                              free(global_xyz);
                              free(local_258);
                              free(local_2d0);
                              uVar8 = ref_list_free(ref_list);
                              if (uVar8 != 0) {
                                pcVar18 = "free list";
                                uVar15 = 0x5ec;
                                goto LAB_00174f5a;
                              }
                              uVar13 = 0;
                              uVar10 = (ulong)(uint)pRVar5->max;
                              if (pRVar5->max < 1) {
                                uVar10 = uVar13;
                              }
                              while( true ) {
                                if (uVar10 == uVar13) {
                                  uVar8 = ref_search_free(ref_search);
                                  if (uVar8 == 0) {
                                    return 0;
                                  }
                                  uVar10 = (ulong)uVar8;
                                  pcVar18 = "free search";
                                  uVar15 = 0x744;
                                  goto LAB_00173edd;
                                }
                                if (((-1 < pRVar5->global[uVar13]) &&
                                    (pRVar5->ref_mpi->id == pRVar5->part[uVar13])) &&
                                   (ref_interp->cell[uVar13] == -1)) break;
                                uVar13 = uVar13 + 1;
                              }
                              pcVar18 = "node missed by tree";
                              uVar15 = 0x5f0;
                              goto LAB_00174856;
                            }
                            pcVar18 = "blind send proc";
                            uVar15 = 0x5bd;
LAB_00174f5a:
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                   ,uVar15,"ref_interp_nearest_tet_via_tri_in_tree",(ulong)uVar8,
                                   pcVar18);
                            uVar10 = (ulong)uVar8;
                            goto LAB_001743ad;
                          }
                          uVar10 = (ulong)uVar8;
                          pcVar18 = "who";
                          uVar15 = 0x597;
                          goto LAB_00174156;
                        }
                        RVar16 = global_node[local_320];
                        *(undefined4 *)((long)local_308 + local_320 * 4) = 0xffffffff;
                        *(REF_INT *)((long)local_2d8 + local_320 * 4) = RVar16;
                        local_300[local_320] = 1e+20;
                        local_330 = (REF_DBL *)(local_320 * 0x18);
                        uVar8 = ref_search_nearest_candidates
                                          (ref_search_00,ref_list,global_xyz + local_320 * 3);
                        pRVar7 = ref_list;
                        if (uVar8 != 0) {
                          uVar10 = (ulong)uVar8;
                          pcVar18 = "near candidates";
                          uVar15 = 0x585;
                          goto LAB_00174156;
                        }
                        iVar19 = ref_list->n;
                        if (0 < iVar19) {
                          local_330 = (REF_DBL *)((long)local_330 + (long)global_xyz);
                          local_310 = ref_interp->from_tri;
                          local_2a8 = ref_interp->from_tet;
                          local_318 = ref_interp->from_grid->node;
                          local_2f0 = -999.0;
                          cell = -1;
                          for (local_328 = (void *)0x0; (long)local_328 < (long)iVar19;
                              local_328 = (void *)((long)local_328 + 1)) {
                            RVar16 = pRVar7->value[(long)local_328];
                            uVar8 = ref_cell_nodes(local_310,RVar16,tri_nodes);
                            if (uVar8 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                     ,0x1d0,"ref_interp_best_tri_in_list",(ulong)uVar8,"cell");
                              uVar10 = (ulong)uVar8;
                              goto LAB_00174905;
                            }
                            uVar8 = ref_node_bary3d(local_318,tri_nodes,local_330,local_278);
                            if ((uVar8 & 0xfffffffb) != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                     ,0x1d2,"ref_interp_best_tri_in_list",(ulong)uVar8,"bary");
                              uVar10 = (ulong)uVar8;
                            }
                            if (uVar8 != 4) {
                              if (uVar8 != 0) {
                                if ((int)uVar10 != 0) goto LAB_00174905;
                                goto LAB_001747f1;
                              }
                              dVar22 = local_278[0];
                              if (local_278[1] <= local_278[0]) {
                                dVar22 = local_278[1];
                              }
                              if (local_278[2] <= dVar22) {
                                dVar22 = local_278[2];
                              }
                              if ((cell == -1) || (local_2f0 < dVar22)) {
                                local_2f0 = dVar22;
                                cell = RVar16;
                              }
                            }
                            iVar19 = pRVar7->n;
                          }
                          if (cell == -1) {
                            pcVar18 = "failed to find tri";
                            uVar15 = 0x1dd;
LAB_00174b50:
                            printf("%s: %d: %s: %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                   ,uVar15,"ref_interp_best_tri_in_list",pcVar18);
LAB_00174b8d:
                            uVar10 = 1;
                          }
                          else {
                            uVar8 = ref_cell_nodes(local_310,cell,tri_nodes);
                            if (uVar8 == 0) {
                              uVar8 = ref_node_bary3d(local_318,tri_nodes,local_330,local_278);
                              if (uVar8 == 0) {
                                tri_nodes[3] = tri_nodes[0];
                                uVar8 = ref_cell_with_face(local_2a8,tri_nodes,&tet0,&tet1);
                                if (uVar8 == 0) {
                                  if (tet0 == -1) {
                                    pcVar18 = "no tet for tri";
                                    uVar15 = 0x1e3;
                                    goto LAB_00174b50;
                                  }
                                  if ((long)tet1 != -1) {
                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                           ,0x1e4,"ref_interp_best_tri_in_list",
                                           "found two tets for boundary face",0xffffffffffffffff,
                                           (long)tet1);
                                    goto LAB_00174b8d;
                                  }
                                  *(REF_INT *)((long)local_308 + local_320 * 4) = tet0;
                                  uVar8 = ref_cell_nodes(local_2a8,tet0,tet_nodes);
                                  if (uVar8 == 0) {
                                    for (lVar12 = 0; lVar12 != 4; lVar12 = lVar12 + 1) {
                                      bary[lVar12] = 0.0;
                                      iVar19 = tet_nodes[lVar12];
                                      for (lVar17 = 0; lVar17 != 3; lVar17 = lVar17 + 1) {
                                        if (tri_nodes[lVar17] == iVar19) {
                                          bary[lVar12] = local_278[lVar17];
                                        }
                                      }
                                    }
                                    dVar22 = bary[0];
                                    if (bary[1] <= bary[0]) {
                                      dVar22 = bary[1];
                                    }
                                    RVar23 = bary[2];
                                    if (bary[3] <= bary[2]) {
                                      RVar23 = bary[3];
                                    }
                                    if (RVar23 <= dVar22) {
                                      dVar22 = RVar23;
                                    }
                                    local_300[local_320] = -dVar22;
                                    goto LAB_001747f1;
                                  }
                                  uVar10 = (ulong)uVar8;
                                  pcVar18 = "cell";
                                  uVar15 = 0x1e7;
                                }
                                else {
                                  uVar10 = (ulong)uVar8;
                                  pcVar18 = "find with face";
                                  uVar15 = 0x1e2;
                                }
                              }
                              else {
                                uVar10 = (ulong)uVar8;
                                pcVar18 = "bary3d";
                                uVar15 = 0x1e0;
                              }
                            }
                            else {
                              uVar10 = (ulong)uVar8;
                              pcVar18 = "cell";
                              uVar15 = 0x1df;
                            }
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                   ,uVar15,"ref_interp_best_tri_in_list",uVar10,pcVar18);
                          }
LAB_00174905:
                          pcVar18 = "best in list";
                          uVar15 = 0x58a;
                          goto LAB_00174156;
                        }
                        *(undefined4 *)((long)local_308 + local_320 * 4) = 0xffffffff;
LAB_001747f1:
                        ref_interp->tree_cells = ref_interp->tree_cells + ref_list->n;
                        uVar8 = ref_list_erase(ref_list);
                        local_320 = local_320 + 1;
                      } while (uVar8 == 0);
                      uVar10 = (ulong)uVar8;
                      pcVar18 = "reset list";
                      uVar15 = 0x593;
                      goto LAB_00174156;
                    }
                    pcVar18 = "malloc from_proc of REF_INT NULL";
                    uVar15 = 0x57e;
                  }
                }
              }
              goto LAB_001743a3;
            }
            pcVar18 = "malloc best_bary of REF_DBL negative";
            uVar15 = 0x57b;
LAB_00174856:
            uVar10 = 1;
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                   ,uVar15,"ref_interp_nearest_tet_via_tri_in_tree",pcVar18);
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                   ,0x579,"ref_interp_nearest_tet_via_tri_in_tree",(ulong)uVar8,"cat");
            uVar10 = (ulong)uVar8;
          }
          goto LAB_001743ad;
        }
        pcVar18 = "malloc local_xyz of REF_DBL NULL";
        uVar15 = 0x568;
      }
LAB_001743a3:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
             uVar15,"ref_interp_nearest_tet_via_tri_in_tree",pcVar18);
      uVar10 = 2;
    }
  }
  else {
    uVar10 = (ulong)uVar8;
    pcVar18 = "create list";
    uVar15 = 0x55f;
LAB_00174156:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",uVar15
           ,"ref_interp_nearest_tet_via_tri_in_tree",uVar10,pcVar18);
  }
LAB_001743ad:
  pcVar18 = "near tri";
  uVar15 = 0x743;
LAB_00173edd:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",uVar15,
         "ref_interp_locate_nearest",uVar10,pcVar18);
  return (REF_STATUS)uVar10;
}

Assistant:

REF_FCN REF_STATUS ref_interp_locate_nearest(REF_INTERP ref_interp) {
  REF_MPI ref_mpi = ref_interp_mpi(ref_interp);
  REF_GRID from_grid = ref_interp_from_grid(ref_interp);

  REF_CELL from_tri = ref_interp_from_tri(ref_interp);
  REF_NODE from_node = ref_grid_node(from_grid);

  REF_BOOL increase_fuzz;
  REF_SEARCH ref_search;
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL center[3], radius;

  if (ref_interp->instrument)
    RSS(ref_mpi_stopwatch_start(ref_mpi), "locate clock");

  RSS(ref_interp_seed_tree(ref_interp), "seed tree nodes");
  if (ref_interp->instrument)
    RSS(ref_mpi_stopwatch_stop(ref_mpi, "seed tree"), "locate clock");

  RSS(ref_interp_process_agents(ref_interp), "drain");
  if (ref_interp->instrument)
    RSS(ref_mpi_stopwatch_stop(ref_mpi, "drain"), "locate clock");

  increase_fuzz = REF_FALSE;
  RSS(ref_interp_tree(ref_interp, &increase_fuzz), "tree");
  if (ref_interp->instrument)
    RSS(ref_mpi_stopwatch_stop(ref_mpi, "tree"), "locate clock");

  if (increase_fuzz) {
    RSS(ref_search_create(&ref_search, ref_cell_n(from_tri)), "create search");
    each_ref_cell_valid_cell_with_nodes(from_tri, cell, nodes) {
      RSS(ref_node_bounding_sphere(from_node, nodes, 3, center, &radius), "b");
      RSS(ref_search_insert(ref_search, cell, center,
                            ref_interp_search_donor_scale(ref_interp) * radius),
          "ins");
    }
    RSS(ref_interp_nearest_tet_via_tri_in_tree(ref_interp, ref_search),
        "near tri");
    RSS(ref_search_free(ref_search), "free search");
  }

  return REF_SUCCESS;
}